

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3FkLocateIndex(Parse *pParse,Table *pParent,FKey *pFKey,Index **ppIdx,int **paiCol)

{
  short sVar1;
  uint uVar2;
  char *zRight;
  char *zRight_00;
  int iVar3;
  char *zIdxCol;
  char *zDfltColl;
  uint uStack_60;
  i16 iCol;
  int j;
  int i_1;
  int i;
  char *zKey;
  int *piStack_48;
  int nCol;
  int *aiCol;
  Index *pIdx;
  int **paiCol_local;
  Index **ppIdx_local;
  FKey *pFKey_local;
  Table *pParent_local;
  Parse *pParse_local;
  
  piStack_48 = (int *)0x0;
  uVar2 = pFKey->nCol;
  zRight = pFKey->aCol[0].zCol;
  if (uVar2 == 1) {
    if (-1 < pParent->iPKey) {
      if (zRight == (char *)0x0) {
        return 0;
      }
      iVar3 = sqlite3StrICmp(pParent->aCol[pParent->iPKey].zName,zRight);
      if (iVar3 == 0) {
        return 0;
      }
    }
  }
  else if (paiCol != (int **)0x0) {
    piStack_48 = (int *)sqlite3DbMallocRawNN(pParse->db,(long)(int)uVar2 << 2);
    if (piStack_48 == (int *)0x0) {
      return 1;
    }
    *paiCol = piStack_48;
  }
  aiCol = (int *)pParent->pIndex;
  do {
    if (aiCol == (int *)0x0) {
LAB_00462d43:
      if (aiCol == (int *)0x0) {
        if (pParse->disableTriggers == '\0') {
          sqlite3ErrorMsg(pParse,"foreign key mismatch - \"%w\" referencing \"%w\"",
                          pFKey->pFrom->zName,pFKey->zTo);
        }
        sqlite3DbFree(pParse->db,piStack_48);
        pParse_local._4_4_ = 1;
      }
      else {
        *ppIdx = (Index *)aiCol;
        pParse_local._4_4_ = 0;
      }
      return pParse_local._4_4_;
    }
    if (((*(ushort *)((long)aiCol + 0x5e) == uVar2) && (*(char *)((long)aiCol + 0x62) != '\0')) &&
       (*(long *)(aiCol + 0x12) == 0)) {
      if (zRight == (char *)0x0) {
        if ((*(byte *)((long)aiCol + 99) & 3) == 2) {
          if (piStack_48 != (int *)0x0) {
            for (j = 0; j < (int)uVar2; j = j + 1) {
              piStack_48[j] = pFKey->aCol[j].iFrom;
            }
          }
          goto LAB_00462d43;
        }
      }
      else {
        uStack_60 = 0;
        while (((int)uStack_60 < (int)uVar2 &&
               (sVar1 = *(short *)(*(long *)(aiCol + 2) + (long)(int)uStack_60 * 2), -1 < sVar1))) {
          zIdxCol = pParent->aCol[sVar1].zColl;
          if (zIdxCol == (char *)0x0) {
            zIdxCol = "BINARY";
          }
          iVar3 = sqlite3StrICmp(*(char **)(*(long *)(aiCol + 0x10) + (long)(int)uStack_60 * 8),
                                 zIdxCol);
          if (iVar3 != 0) break;
          zRight_00 = pParent->aCol[sVar1].zName;
          for (zDfltColl._4_4_ = 0; (int)zDfltColl._4_4_ < (int)uVar2;
              zDfltColl._4_4_ = zDfltColl._4_4_ + 1) {
            iVar3 = sqlite3StrICmp(pFKey->aCol[(int)zDfltColl._4_4_].zCol,zRight_00);
            if (iVar3 == 0) {
              if (piStack_48 != (int *)0x0) {
                piStack_48[(int)uStack_60] = pFKey->aCol[(int)zDfltColl._4_4_].iFrom;
              }
              break;
            }
          }
          if (zDfltColl._4_4_ == uVar2) break;
          uStack_60 = uStack_60 + 1;
        }
        if (uStack_60 == uVar2) goto LAB_00462d43;
      }
    }
    aiCol = *(int **)(aiCol + 10);
  } while( true );
}

Assistant:

SQLITE_PRIVATE int sqlite3FkLocateIndex(
  Parse *pParse,                  /* Parse context to store any error in */
  Table *pParent,                 /* Parent table of FK constraint pFKey */
  FKey *pFKey,                    /* Foreign key to find index for */
  Index **ppIdx,                  /* OUT: Unique index on parent table */
  int **paiCol                    /* OUT: Map of index columns in pFKey */
){
  Index *pIdx = 0;                    /* Value to return via *ppIdx */
  int *aiCol = 0;                     /* Value to return via *paiCol */
  int nCol = pFKey->nCol;             /* Number of columns in parent key */
  char *zKey = pFKey->aCol[0].zCol;   /* Name of left-most parent key column */

  /* The caller is responsible for zeroing output parameters. */
  assert( ppIdx && *ppIdx==0 );
  assert( !paiCol || *paiCol==0 );
  assert( pParse );

  /* If this is a non-composite (single column) foreign key, check if it 
  ** maps to the INTEGER PRIMARY KEY of table pParent. If so, leave *ppIdx 
  ** and *paiCol set to zero and return early. 
  **
  ** Otherwise, for a composite foreign key (more than one column), allocate
  ** space for the aiCol array (returned via output parameter *paiCol).
  ** Non-composite foreign keys do not require the aiCol array.
  */
  if( nCol==1 ){
    /* The FK maps to the IPK if any of the following are true:
    **
    **   1) There is an INTEGER PRIMARY KEY column and the FK is implicitly 
    **      mapped to the primary key of table pParent, or
    **   2) The FK is explicitly mapped to a column declared as INTEGER
    **      PRIMARY KEY.
    */
    if( pParent->iPKey>=0 ){
      if( !zKey ) return 0;
      if( !sqlite3StrICmp(pParent->aCol[pParent->iPKey].zName, zKey) ) return 0;
    }
  }else if( paiCol ){
    assert( nCol>1 );
    aiCol = (int *)sqlite3DbMallocRawNN(pParse->db, nCol*sizeof(int));
    if( !aiCol ) return 1;
    *paiCol = aiCol;
  }

  for(pIdx=pParent->pIndex; pIdx; pIdx=pIdx->pNext){
    if( pIdx->nKeyCol==nCol && IsUniqueIndex(pIdx) && pIdx->pPartIdxWhere==0 ){ 
      /* pIdx is a UNIQUE index (or a PRIMARY KEY) and has the right number
      ** of columns. If each indexed column corresponds to a foreign key
      ** column of pFKey, then this index is a winner.  */

      if( zKey==0 ){
        /* If zKey is NULL, then this foreign key is implicitly mapped to 
        ** the PRIMARY KEY of table pParent. The PRIMARY KEY index may be 
        ** identified by the test.  */
        if( IsPrimaryKeyIndex(pIdx) ){
          if( aiCol ){
            int i;
            for(i=0; i<nCol; i++) aiCol[i] = pFKey->aCol[i].iFrom;
          }
          break;
        }
      }else{
        /* If zKey is non-NULL, then this foreign key was declared to
        ** map to an explicit list of columns in table pParent. Check if this
        ** index matches those columns. Also, check that the index uses
        ** the default collation sequences for each column. */
        int i, j;
        for(i=0; i<nCol; i++){
          i16 iCol = pIdx->aiColumn[i];     /* Index of column in parent tbl */
          const char *zDfltColl;            /* Def. collation for column */
          char *zIdxCol;                    /* Name of indexed column */

          if( iCol<0 ) break; /* No foreign keys against expression indexes */

          /* If the index uses a collation sequence that is different from
          ** the default collation sequence for the column, this index is
          ** unusable. Bail out early in this case.  */
          zDfltColl = pParent->aCol[iCol].zColl;
          if( !zDfltColl ) zDfltColl = sqlite3StrBINARY;
          if( sqlite3StrICmp(pIdx->azColl[i], zDfltColl) ) break;

          zIdxCol = pParent->aCol[iCol].zName;
          for(j=0; j<nCol; j++){
            if( sqlite3StrICmp(pFKey->aCol[j].zCol, zIdxCol)==0 ){
              if( aiCol ) aiCol[i] = pFKey->aCol[j].iFrom;
              break;
            }
          }
          if( j==nCol ) break;
        }
        if( i==nCol ) break;      /* pIdx is usable */
      }
    }
  }

  if( !pIdx ){
    if( !pParse->disableTriggers ){
      sqlite3ErrorMsg(pParse,
           "foreign key mismatch - \"%w\" referencing \"%w\"",
           pFKey->pFrom->zName, pFKey->zTo);
    }
    sqlite3DbFree(pParse->db, aiCol);
    return 1;
  }

  *ppIdx = pIdx;
  return 0;
}